

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optimize.cc
# Opt level: O2

void __thiscall kratos::InsertSyncReset::visit(InsertSyncReset *this,Generator *generator)

{
  string *port_name;
  pointer psVar1;
  pointer psVar2;
  bool bVar3;
  int iVar4;
  undefined4 extraout_var;
  undefined1 auVar5 [8];
  long lVar6;
  undefined1 local_a0 [8];
  shared_ptr<kratos::Stmt> stmt;
  pointer local_88;
  undefined1 local_60 [8];
  shared_ptr<kratos::StmtBlock> blk;
  Port *local_48;
  undefined1 local_40 [8];
  shared_ptr<kratos::SequentialStmtBlock> seq;
  
  if (((((generator->lib_files_).
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start ==
         (generator->lib_files_).
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish) && ((generator->is_external_ & 1U) == 0)) &&
      (generator->is_stub_ == false)) && (this->run_pass_ == true)) {
    port_name = &this->reset_name_;
    bVar3 = Generator::has_port(generator,port_name);
    if (bVar3) {
      Generator::get_port((Generator *)local_a0,(string *)generator);
      local_48 = (Port *)local_a0;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&stmt);
      if (*(PortType *)((long)local_48 + 0x274) != Reset) {
        (*(local_48->super_Var).super_IRNode._vptr_IRNode[0x2b])(local_48,3);
      }
    }
    else {
      local_48 = Generator::port(generator,In,port_name,1,Reset);
    }
    psVar1 = (generator->stmts_).
             super__Vector_base<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    psVar2 = (generator->stmts_).
             super__Vector_base<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    for (lVar6 = 0; (long)psVar1 - (long)psVar2 >> 4 != lVar6; lVar6 = lVar6 + 1) {
      Generator::get_stmt((Generator *)local_a0,(uint32_t)generator);
      if (*(int *)&(((Var *)local_a0)->name)._M_dataplus._M_p == 4) {
        Stmt::as<kratos::StmtBlock>((Stmt *)local_60);
        if (*(StatementBlockType *)((long)local_60 + 0xd8) == Sequential) {
          Stmt::as<kratos::SequentialStmtBlock>((Stmt *)local_40);
          inject_reset_logic(this,(SequentialStmtBlock *)local_40,local_48);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&seq);
        }
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&blk);
      }
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&stmt);
    }
    Generator::get_child_generators
              ((vector<std::shared_ptr<kratos::Generator>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>
                *)local_60,generator);
    for (auVar5 = local_60;
        auVar5 != (undefined1  [8])
                  blk.super___shared_ptr<kratos::StmtBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        auVar5 = (undefined1  [8])
                 &(((element_type *)auVar5)->super_Stmt).super_IRNode.fn_name_ln.
                  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish) {
      bVar3 = Generator::has_port((Generator *)
                                  (((element_type *)auVar5)->super_Stmt).super_IRNode._vptr_IRNode,
                                  port_name);
      if (bVar3) {
        Generator::get_port((Generator *)local_40,
                            (string *)
                            (((element_type *)auVar5)->super_Stmt).super_IRNode._vptr_IRNode);
        iVar4 = (*(((StmtBlock *)local_40)->super_Stmt).super_IRNode._vptr_IRNode[0x10])();
        std::
        _Hashtable<std::shared_ptr<kratos::AssignStmt>,_std::shared_ptr<kratos::AssignStmt>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>,_std::__detail::_Identity,_std::equal_to<std::shared_ptr<kratos::AssignStmt>_>,_std::hash<std::shared_ptr<kratos::AssignStmt>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
        ::_Hashtable((_Hashtable<std::shared_ptr<kratos::AssignStmt>,_std::shared_ptr<kratos::AssignStmt>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>,_std::__detail::_Identity,_std::equal_to<std::shared_ptr<kratos::AssignStmt>_>,_std::hash<std::shared_ptr<kratos::AssignStmt>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                      *)local_a0,
                     (_Hashtable<std::shared_ptr<kratos::AssignStmt>,_std::shared_ptr<kratos::AssignStmt>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>,_std::__detail::_Identity,_std::equal_to<std::shared_ptr<kratos::AssignStmt>_>,_std::hash<std::shared_ptr<kratos::AssignStmt>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                      *)CONCAT44(extraout_var,iVar4));
        if (local_88 < (pointer)0x2) {
          if ((local_88 == (pointer)0x1) &&
             (*(int *)(*(long *)(*(long *)&(stmt.
                                            super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>
                                            ._M_refcount._M_pi)->_M_use_count + 200) + 0x168) == 3))
          {
            (*(((StmtBlock *)local_40)->super_Stmt).super_IRNode._vptr_IRNode[0x12])(local_40,1);
          }
          Generator::wire(generator,(Var *)local_40,&local_48->super_Var);
        }
        std::
        _Hashtable<std::shared_ptr<kratos::AssignStmt>,_std::shared_ptr<kratos::AssignStmt>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>,_std::__detail::_Identity,_std::equal_to<std::shared_ptr<kratos::AssignStmt>_>,_std::hash<std::shared_ptr<kratos::AssignStmt>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
        ::~_Hashtable((_Hashtable<std::shared_ptr<kratos::AssignStmt>,_std::shared_ptr<kratos::AssignStmt>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>,_std::__detail::_Identity,_std::equal_to<std::shared_ptr<kratos::AssignStmt>_>,_std::hash<std::shared_ptr<kratos::AssignStmt>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                       *)local_a0);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&seq);
      }
    }
    std::
    vector<std::shared_ptr<kratos::Generator>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>
    ::~vector((vector<std::shared_ptr<kratos::Generator>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>
               *)local_60);
  }
  return;
}

Assistant:

void visit(Generator* generator) override {
        if (generator->external() || generator->is_stub()) return;
        if (!run_pass_) return;
        Port* port;
        if (generator->has_port(reset_name_)) {
            port = generator->get_port(reset_name_).get();
            if (port->port_type() != PortType::Reset) {
                port->set_port_type(PortType::Reset);
            }
        } else {
            // create a synchronous reset port
            port = &generator->port(PortDirection::In, reset_name_, 1, PortType::Reset);
        }
        // look through each sequential block
        auto stmts_count = generator->stmts_count();
        for (uint64_t i = 0; i < stmts_count; i++) {
            auto stmt = generator->get_stmt(i);
            if (stmt->type() == StatementType::Block) {
                auto blk = stmt->as<StmtBlock>();
                if (blk->block_type() == StatementBlockType::Sequential) {
                    auto seq = blk->as<SequentialStmtBlock>();
                    inject_reset_logic(seq.get(), port);
                }
            }
        }

        // wire the children. we do in this order since this pass is run in parallel from bottom
        // up
        for (auto const& child : generator->get_child_generators()) {
            if (child->has_port(reset_name_)) {
                auto child_port = child->get_port(reset_name_);
                auto sources = child_port->sources();
                if (sources.size() > 1) continue;
                if (sources.size() == 1) {
                    auto* right = (*sources.begin())->right();
                    if (right->type() == VarType::ConstValue) {
                        child_port->clear_sources(true);
                    }
                }
                generator->wire(*child_port, *port);
            }
        }
    }